

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_35bf99::PpuTest_visible_scanline_output_background_left_disabled_Test::TestBody
          (PpuTest_visible_scanline_output_background_left_disabled_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar1;
  uint extraout_var;
  char *message;
  char *in_R9;
  uint uVar2;
  bool bVar3;
  Color expected_color;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  optional<n_e_s::core::Pixel> pixel;
  MatcherBase<unsigned_short> local_48;
  
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).registers.cycle = 1;
  (this->super_PpuTest).registers.pattern_table_shifter_low = 0;
  (this->super_PpuTest).registers.pattern_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.pattern_table_latch_hi = 0xff;
  (this->super_PpuTest).registers.attribute_table_shifter_low = 0xffff;
  (this->super_PpuTest).registers.attribute_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.attribute_table_latch = 0xff;
  this_00 = &(this->super_PpuTest).mmu;
  local_48.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<unsigned_short>::
       GetVTable<testing::internal::MatcherBase<unsigned_short>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00267db8;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26b,"mmu","read_byte(testing::_)");
  testing::internal::ReturnAction<int>::ReturnAction((ReturnAction<int> *)&expected_color,0xff);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&expected_color);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar1,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,0x3f00);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26c,"mmu","read_byte(0x3F00)");
  testing::internal::ReturnAction<int>::ReturnAction((ReturnAction<int> *)&expected_color,5);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&expected_color);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar1,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,0x3f0e);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26e,"mmu","read_byte(0x3F00 + 3u * 4u + 2u)");
  testing::internal::ReturnAction<int>::ReturnAction((ReturnAction<int> *)&expected_color,6);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)&gtest_ar_,(ReturnAction *)&expected_color);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar1,(Action<unsigned_char_(unsigned_short)> *)&gtest_ar_);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    pixel.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
    super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ =
         (*((this->super_PpuTest).ppu._M_t.
            super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
            super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
            super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    pixel.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
    super__Optional_payload_base<n_e_s::core::Pixel>._4_2_ = SUB42(extraout_var,0);
    gtest_ar_.success_ = SUB41(extraout_var >> 8,0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if ((extraout_var & 0x100) == 0) {
      testing::Message::Message((Message *)&local_48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"pixel.has_value()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&expected_color,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x273,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&expected_color,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_color);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                  ();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bVar3 = uVar2 < 8;
    expected_color.b = '\0';
    if (bVar3) {
      expected_color.b = '0';
    }
    expected_color.r = bVar3 << 3 | 0x54;
    expected_color.g = !bVar3 << 2;
    testing::internal::CmpHelperEQ<n_e_s::core::Color,n_e_s::core::Color>
              ((internal *)&gtest_ar,"expected_color","pixel->color",&expected_color,
               &pixel.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x277,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST_F(PpuTest, visible_scanline_output_background_left_disabled) {
    // Render background, but not first 8 pixels.
    registers.mask = expected.mask = PpuMask(0b0000'1000);
    registers.cycle = 1;
    registers.pattern_table_shifter_hi = 0b1111'1111'1111'1111;
    registers.pattern_table_shifter_low = 0b0000'0000'0000'0000u;
    registers.pattern_table_latch_hi = 0xFF;
    registers.attribute_table_shifter_hi = 0xFFFF;
    registers.attribute_table_shifter_low = 0xFFFF;
    registers.attribute_table_latch = 0xFF;

    EXPECT_CALL(mmu, read_byte(testing::_)).WillRepeatedly(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(0x3F00)).WillRepeatedly(Return(0x05));
    // Third palette (from attribute)
    EXPECT_CALL(mmu, read_byte(0x3F00 + 3u * 4u + 2u))
            .WillRepeatedly(Return(0x06));

    for (int i = 0; i < 10; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_TRUE(pixel.has_value());
        // Return 5th color first 8 pixels (background from 0x3F00)
        // and 6th color the following pixels.
        const auto expected_color = i < 8 ? Color{92, 0, 48} : Color{84, 4, 0};
        EXPECT_EQ(expected_color, pixel->color);
    }
}